

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v6::internal::
    parse_nonnegative_int<wchar_t,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&>
              (wchar_t **begin,wchar_t *end,
              specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
              *eh)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  uint uVar3;
  
  uVar3 = 0;
  pwVar1 = *begin;
  do {
    pwVar2 = pwVar1 + 1;
    if (0xccccccc < uVar3) {
      *begin = pwVar1;
      uVar3 = 0x80000000;
      goto LAB_00165663;
    }
    uVar3 = (uVar3 * 10 + *pwVar1) - 0x30;
  } while ((pwVar2 != end) && (pwVar1 = pwVar2, (uint)(*pwVar2 + L'\xffffffd0') < 10));
  *begin = pwVar2;
  if ((int)uVar3 < 0) {
LAB_00165663:
    specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    ::on_error(&eh->
                super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
               ,"number is too big");
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}